

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *runnerExe_00;
  int iVar1;
  uint uVar2;
  DWORD DVar3;
  DWORD DVar4;
  char *pcVar5;
  TLabTest TVar6;
  _func_int *local_70;
  double msElapsed;
  int millisecondsPerDay;
  double ms1;
  double ms0;
  char *runnerCommand;
  char *runnerExe;
  int local_20;
  int fail;
  int count;
  int i;
  char **argv_local;
  int argc_local;
  
  runnerExe_00 = *argv;
  _count = argv;
  argv_local._0_4_ = argc;
  if ((2 < argc) && (iVar1 = strcmp(argv[1],"-a"), iVar1 == 0)) {
    UserTestAll = 1;
    _count = argv + 1;
    argv_local._0_4_ = argc + -1;
  }
  if (((3 < (int)argv_local) && (iVar1 = strcmp(_count[1],"-m"), iVar1 == 0)) &&
     (iVar1 = atoi(_count[2]), iVar1 != 0)) {
    iVar1 = atoi(_count[2]);
    UserMemoryLimit = iVar1 << 10;
    _count = _count + 2;
    argv_local._0_4_ = (int)argv_local + -2;
  }
  if (((3 < (int)argv_local) && (iVar1 = strcmp(_count[1],"-t"), iVar1 == 0)) &&
     (iVar1 = atoi(_count[2]), iVar1 != 0)) {
    UserTimeout = atoi(_count[2]);
    _count = _count + 2;
    argv_local._0_4_ = (int)argv_local + -2;
  }
  if (((int)argv_local < 3) || (iVar1 = strcmp(_count[1],"-e"), iVar1 != 0)) {
    PrintWithoutBuffering("\nKOI FIT NSU Lab Tester (c) 2009-2020 by Evgueni Petrov\n");
    if ((int)argv_local < 2) {
      PrintWithoutBuffering("\nTo test mylab.exe, do %s mylab.exe\n",runnerExe_00);
      argv_local._4_4_ = 1;
    }
    else {
      pcVar5 = GetTesterName();
      PrintWithoutBuffering("\nTesting %s...\n",pcVar5);
      fail = 0;
      local_20 = 0;
      while( true ) {
        runnerExe._4_4_ = 0;
        iVar1 = GetTestCount();
        if (iVar1 <= fail) break;
        uVar2 = GetTestCount();
        PrintWithoutBuffering("TEST %d/%d: ",(ulong)(fail + 1),(ulong)uVar2);
        TVar6 = GetLabTest(fail);
        runnerCommand = (char *)TVar6.Feeder;
        iVar1 = (*(code *)runnerCommand)();
        if (iVar1 != 0) {
          if (UserTestAll == 0) break;
          runnerExe._4_4_ = 1;
        }
        pcVar5 = GetRunnerCommand(runnerExe_00,_count[1]);
        if (pcVar5 == (char *)0x0) break;
        DVar3 = GetTickCount();
        iVar1 = system(pcVar5);
        if (iVar1 != 0) break;
        DVar4 = GetTickCount();
        PrintWithoutBuffering
                  ("%.0f ms, ",
                   (double)(((int)((double)DVar4 - (double)DVar3) + 86400000) % 86400000));
        TVar6 = GetLabTest(fail);
        local_70 = TVar6.Checker;
        iVar1 = (*local_70)();
        if (iVar1 != 0) {
          if (UserTestAll == 0) break;
          runnerExe._4_4_ = 1;
        }
        local_20 = (1 - runnerExe._4_4_) + local_20;
        fail = fail + 1;
      }
      iVar1 = GetTestCount();
      if (local_20 < iVar1) {
        PrintWithoutBuffering
                  ("\n:-(\n\nExecutable file %s failed for input file in.txt in the current directory.\nPlease fix and try again.\n"
                   ,_count[1]);
        argv_local._4_4_ = 1;
      }
      else {
        PrintWithoutBuffering
                  ("\n:-)\n\nExecutable file %s passed all tests.\nPlease review the source code with your teaching assistant.\n"
                   ,_count[1]);
        argv_local._4_4_ = 0;
      }
    }
  }
  else {
    argv_local._4_4_ = LaunchLabExecutable(_count[2]);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    int i, count, fail;
    const char* runnerExe = argv[0];

    if (argc >= 3 && strcmp(argv[1], "-a") == 0) {
        UserTestAll = 1;
        argv++;
        argc--;
    }
    if (argc >= 4 && strcmp(argv[1], "-m") == 0 && atoi(argv[2]) != 0) {
        UserMemoryLimit = atoi(argv[2])*1024;
        argv += 2;
        argc -= 2;
    }
    if (argc >= 4 && strcmp(argv[1], "-t") == 0 && atoi(argv[2]) != 0) {
        UserTimeout = atoi(argv[2]);
        argv += 2;
        argc -= 2;
    }
    if (argc >= 3 && strcmp(argv[1], "-e") == 0) {
        return LaunchLabExecutable(argv[2]);
    }

    PrintWithoutBuffering("\nKOI FIT NSU Lab Tester (c) 2009-2020 by Evgueni Petrov\n");

    if (argc < 2) {
        PrintWithoutBuffering("\nTo test mylab.exe, do %s mylab.exe\n", runnerExe);
        return 1;
    }

    PrintWithoutBuffering("\nTesting %s...\n", GetTesterName());

    for (i = 0, count = 0, fail = 0; i < GetTestCount(); i++, fail = 0) {
        PrintWithoutBuffering("TEST %d/%d: ", i+1, GetTestCount());
        if (GetLabTest(i).Feeder() != 0) {
            if (!UserTestAll) {
                break;
            }
            fail = 1;
        }
        const char* runnerCommand = GetRunnerCommand(runnerExe, argv[1]);
        if (!runnerCommand) {
            break;
        }
        double ms0 = GetTickCount();
        if (system(runnerCommand) != 0) {
            break;
        }
        double ms1 = GetTickCount();
        int millisecondsPerDay = 1000 * 60 * 60 * 24;
        double msElapsed = ((int)(ms1 - ms0) + millisecondsPerDay) % millisecondsPerDay;
        PrintWithoutBuffering("%.0f ms, ", msElapsed);
        if (GetLabTest(i).Checker() != 0) {
            if (!UserTestAll) {
                break;
            }
            fail = 1;
        }
        count += 1 - fail;
    }

    if (count < GetTestCount()) {
        PrintWithoutBuffering("\n:-(\n\n"
        "Executable file %s failed for input file in.txt in the current directory.\n"
        "Please fix and try again.\n", argv[1]);
        return 1;
    } else {
        PrintWithoutBuffering("\n:-)\n\n"
        "Executable file %s passed all tests.\n"
        "Please review the source code with your teaching assistant.\n", argv[1]);
        return 0;
    }
}